

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O2

vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
* __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::
export_filter<boost::asio::ip::address_v4>
          (vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
           *__return_storage_ptr__,filter_impl<std::array<unsigned_char,_4UL>_> *this)

{
  array<unsigned_char,_4UL> aVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  value_type local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  ::reserve(__return_storage_ptr__,
            (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var2 = (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  while ((_Rb_tree_header *)p_Var2 != p_Var3) {
    local_34.last.addr_.s_addr = (in4_addr_type)0;
    local_34.first.addr_.s_addr = (in4_addr_type)p_Var2[1]._M_color;
    local_34.flags = *(uint32_t *)&p_Var2[1].field_0x4;
    p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
    aVar1._M_elems[0] = 0xff;
    aVar1._M_elems[1] = 0xff;
    aVar1._M_elems[2] = 0xff;
    aVar1._M_elems[3] = 0xff;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      aVar1 = minus_one<std::array<unsigned_char,4ul>>((array<unsigned_char,_4UL> *)(p_Var2 + 1));
    }
    local_34.last.addr_.s_addr = (in4_addr_type)(in4_addr_type)aVar1._M_elems;
    ::std::
    vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
    ::push_back(__return_storage_ptr__,&local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ip_range<ExternalAddressType>> filter_impl<Addr>::export_filter() const
	{
		std::vector<ip_range<ExternalAddressType>> ret;
		ret.reserve(m_access_list.size());

		for (auto i = m_access_list.begin()
			, end(m_access_list.end()); i != end;)
		{
			ip_range<ExternalAddressType> r;
			r.first = ExternalAddressType(i->start);
			r.flags = i->access;

			++i;
			if (i == end)
				r.last = ExternalAddressType(max_addr<Addr>());
			else
				r.last = ExternalAddressType(minus_one(i->start));

			ret.push_back(r);
		}
		return ret;
	}